

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O2

string * __thiscall
duckdb::Exception::ConstructMessage<unsigned_long,unsigned_long,unsigned_long,std::__cxx11::string>
          (string *__return_storage_ptr__,Exception *this,string *msg,unsigned_long params,
          unsigned_long params_1,unsigned_long params_2,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params_3)

{
  vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_> values;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff90;
  undefined1 local_68 [56];
  
  local_68._0_8_ = (pointer)0x0;
  local_68._8_8_ = (pointer)0x0;
  local_68._16_8_ = 0;
  ::std::__cxx11::string::string((string *)(local_68 + 0x18),(string *)params_2);
  ConstructMessageRecursive<unsigned_long,unsigned_long,unsigned_long,std::__cxx11::string>
            (__return_storage_ptr__,this,(string *)local_68,
             (vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_> *)
             msg,params,params_1,(unsigned_long)(local_68 + 0x18),in_stack_ffffffffffffff90);
  ::std::__cxx11::string::~string((string *)(local_68 + 0x18));
  ::std::vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>::
  ~vector((vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_> *)
          local_68);
  return __return_storage_ptr__;
}

Assistant:

static string ConstructMessage(const string &msg, ARGS... params) {
		const std::size_t num_args = sizeof...(ARGS);
		if (num_args == 0) {
			return msg;
		}
		std::vector<ExceptionFormatValue> values;
		return ConstructMessageRecursive(msg, values, params...);
	}